

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O0

IceTImage icetSplitCompose(void)

{
  IceTInt tile_00;
  IceTBoolean IVar1;
  IceTSizeType IVar2;
  int iVar3;
  IceTInt *pIVar4;
  IceTBoolean *pIVar5;
  IceTVoid *pIVar6;
  IceTCommRequest pIVar7;
  IceTSparseImage srcBuffer;
  int local_13c;
  IceTSizeType offset_1;
  int idx;
  IceTSizeType truncated_size;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  IceTSizeType offset;
  IceTSizeType sending_frag_size;
  IceTVoid *local_100;
  IceTVoid *local_f8;
  float local_ec;
  float local_e8;
  float ratio_1;
  float max_ratio;
  int max_id;
  float ratio;
  float min_ratio;
  int min_id;
  int allocate;
  IceTVoid *local_c8;
  int local_bc;
  IceTCommRequest *ppIStack_b8;
  int first_incoming;
  IceTCommRequest *requests;
  int num_requests;
  IceTSizeType fragmentSparseImageSize;
  IceTImage imageFragment;
  IceTSparseImage outgoing;
  IceTByte *nextInBuf;
  IceTVoid **incomingBuffers;
  IceTSparseImage incoming;
  int num_allocated;
  int node;
  int image;
  int tile;
  IceTBoolean *all_contained_tiles_masks;
  IceTInt *contained_tiles_list;
  IceTSizeType local_58;
  IceTInt num_contained_tiles;
  IceTInt my_height;
  IceTInt my_width;
  IceTInt *tile_viewports;
  IceTInt tile_displayed;
  IceTInt total_image_count;
  IceTInt *tile_contribs;
  IceTInt max_height;
  IceTInt max_width;
  IceTInt num_tiles;
  IceTInt num_proc;
  IceTInt rank;
  IceTSizeType my_fragment_size;
  IceTInt group_size;
  IceTInt my_tile;
  IceTInt *tile_groups;
  IceTImage fullImage;
  
  icetGetIntegerv(2,&num_tiles);
  icetGetIntegerv(3,&max_width);
  icetGetIntegerv(0x10,&max_height);
  icetGetIntegerv(0x13,(IceTInt *)((long)&tile_contribs + 4));
  icetGetIntegerv(0x14,(IceTInt *)&tile_contribs);
  _tile_displayed = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,(IceTInt *)((long)&tile_viewports + 4));
  icetGetIntegerv(0x1b,(IceTInt *)&tile_viewports);
  _my_height = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x86,(IceTInt *)((long)&contained_tiles_list + 4));
  pIVar4 = icetUnsafeStateGetInteger(0x87);
  pIVar5 = icetUnsafeStateGetBoolean(0x89);
  local_c8 = (IceTVoid *)icetImageNull();
  tile_groups = (IceTInt *)local_c8;
  if (tile_viewports._4_4_ < 1) {
    if (-1 < (int)tile_viewports) {
      num_contained_tiles = _my_height[(int)tile_viewports * 4 + 2];
      local_58 = _my_height[(int)tile_viewports * 4 + 3];
      _min_id = icetGetStateBufferImage(0x1a4,num_contained_tiles,local_58);
      tile_groups = (IceTInt *)_min_id;
      icetClearImage(_min_id);
    }
  }
  else {
    _group_size = (IceTInt *)icetGetStateBuffer(0x1a6,(max_height + 1) * 4);
    incoming.opaque_internals._0_4_ = 0;
    *_group_size = 0;
    for (node = 0; node < max_height; node = node + 1) {
      min_ratio = (float)((_tile_displayed[node] * max_width) / tile_viewports._4_4_);
      if (((int)min_ratio < 1) && (0 < _tile_displayed[node])) {
        min_ratio = 1.4013e-45;
      }
      _group_size[node + 1] = (IceTInt)min_ratio;
      incoming.opaque_internals._0_4_ = (int)min_ratio + (int)incoming.opaque_internals;
    }
    for (; (int)incoming.opaque_internals < max_width;
        incoming.opaque_internals._0_4_ = (int)incoming.opaque_internals + 1) {
      ratio = -NAN;
      max_id = (int)(float)max_width;
      for (node = 0; node < max_height; node = node + 1) {
        if ((_tile_displayed[node] != 0) &&
           (max_ratio = (float)_group_size[node + 1] / (float)_tile_displayed[node],
           max_ratio < (float)max_id)) {
          ratio = (float)node;
          max_id = (int)max_ratio;
        }
      }
      _group_size[(int)ratio + 1] = _group_size[(int)ratio + 1] + 1;
    }
    for (; max_width < (int)incoming.opaque_internals;
        incoming.opaque_internals._0_4_ = (int)incoming.opaque_internals + -1) {
      ratio_1 = -NAN;
      local_e8 = 0.0;
      for (node = 0; node < max_height; node = node + 1) {
        if ((1 < _group_size[node + 1]) &&
           (local_ec = (float)_group_size[node + 1] / (float)_tile_displayed[node],
           local_e8 < local_ec)) {
          ratio_1 = (float)node;
          local_e8 = local_ec;
        }
      }
      _group_size[(int)ratio_1 + 1] = _group_size[(int)ratio_1 + 1] + -1;
    }
    for (node = 1; node < max_height; node = node + 1) {
      _group_size[node] = _group_size[node + -1] + _group_size[node];
    }
    _group_size[max_height] = max_width;
    my_fragment_size = 0;
    while (_group_size[my_fragment_size + 1] <= num_tiles) {
      my_fragment_size = my_fragment_size + 1;
    }
    rank = _group_size[my_fragment_size + 1] - _group_size[my_fragment_size];
    num_contained_tiles = _my_height[my_fragment_size * 4 + 2];
    local_58 = _my_height[my_fragment_size * 4 + 3];
    num_proc = (tile_contribs._4_4_ * (int)tile_contribs + rank + -1) / rank;
    requests._0_4_ = _tile_displayed[my_fragment_size];
    requests._4_4_ = icetSparseImageBufferSize(num_proc,1);
    pIVar6 = icetGetStateBuffer(0x1a1,_tile_displayed[my_fragment_size] << 3);
    local_f8 = (IceTVoid *)
               icetGetStateBufferSparseImage(0x1a2,tile_contribs._4_4_,(int)tile_contribs);
    imageFragment.opaque_internals = local_f8;
    local_100 = (IceTVoid *)icetGetStateBufferImage(0x1a3,num_proc,1);
    _num_requests = (IceTImage)local_100;
    _offset = icetGetStateBufferImage(0x1a4,tile_contribs._4_4_,(int)tile_contribs);
    tile_groups = (IceTInt *)_offset;
    ppIStack_b8 = (IceTCommRequest *)icetGetStateBuffer(0x1a5,(IceTInt)requests << 3);
    outgoing.opaque_internals =
         icetGetStateBuffer(0x1a0,requests._4_4_ * _tile_displayed[my_fragment_size]);
    num_allocated = 0;
    incoming.opaque_internals._4_4_ = 0;
    while (num_allocated < _tile_displayed[my_fragment_size]) {
      if (pIVar5[incoming.opaque_internals._4_4_ * max_height + my_fragment_size] != '\0') {
        *(IceTVoid **)((long)pIVar6 + (long)num_allocated * 8) = outgoing.opaque_internals;
        pIVar7 = icetCommIrecv(*(void **)((long)pIVar6 + (long)num_allocated * 8),requests._4_4_,
                               0x8001,incoming.opaque_internals._4_4_,0x32);
        ppIStack_b8[num_allocated] = pIVar7;
        num_allocated = num_allocated + 1;
        outgoing.opaque_internals = outgoing.opaque_internals + (long)requests._4_4_;
      }
      incoming.opaque_internals._4_4_ = incoming.opaque_internals._4_4_ + 1;
    }
    for (num_allocated = 0; num_allocated < contained_tiles_list._4_4_;
        num_allocated = num_allocated + 1) {
      tile_00 = pIVar4[num_allocated];
      icetGetTileImage(tile_00,(IceTImage)tile_groups);
      package_buffer._0_4_ = 0;
      IVar2 = icetImageGetNumPixels((IceTImage)tile_groups);
      package_buffer._4_4_ =
           (IVar2 + (_group_size[tile_00 + 1] - _group_size[tile_00]) + -1) /
           (_group_size[tile_00 + 1] - _group_size[tile_00]);
      for (incoming.opaque_internals._4_4_ = _group_size[tile_00]; iVar3 = package_buffer._4_4_,
          incoming.opaque_internals._4_4_ < _group_size[tile_00 + 1];
          incoming.opaque_internals._4_4_ = incoming.opaque_internals._4_4_ + 1) {
        IVar2 = icetImageGetNumPixels((IceTImage)tile_groups);
        if (IVar2 - (int)package_buffer < iVar3) {
          IVar2 = icetImageGetNumPixels((IceTImage)tile_groups);
          local_13c = IVar2 - (int)package_buffer;
        }
        else {
          local_13c = package_buffer._4_4_;
        }
        icetCompressSubImage
                  ((IceTImage)tile_groups,(int)package_buffer,local_13c,
                   (IceTSparseImage)imageFragment.opaque_internals);
        icetSparseImagePackageForSend
                  ((IceTSparseImage)imageFragment.opaque_internals,(IceTVoid **)&truncated_size,&idx
                  );
        icetCommSend(_truncated_size,idx,0x8001,incoming.opaque_internals._4_4_,0x32);
        package_buffer._0_4_ = local_13c + (int)package_buffer;
      }
    }
    local_bc = 1;
    for (num_allocated = 0; num_allocated < _tile_displayed[my_fragment_size];
        num_allocated = num_allocated + 1) {
      iVar3 = icetCommWaitany(_tile_displayed[my_fragment_size],ppIStack_b8);
      srcBuffer = icetSparseImageUnpackageFromReceive
                            (*(IceTVoid **)((long)pIVar6 + (long)iVar3 * 8));
      if (local_bc == 0) {
        icetCompressedComposite(_num_requests,srcBuffer,1);
      }
      else {
        icetDecompressImage(srcBuffer,_num_requests);
        local_bc = 0;
      }
    }
    IVar1 = icetIsEnabled(0x146);
    if (IVar1 == '\0') {
      iVar3 = (num_tiles - _group_size[my_fragment_size]) * num_proc;
      num_proc = icetImageGetNumPixels(_num_requests);
      icetImageCopyPixels(_num_requests,0,(IceTImage)tile_groups,iVar3,num_proc);
      icetStateSetInteger(0x8c,my_fragment_size);
      icetStateSetInteger(0x8d,iVar3);
      icetStateSetInteger(0x8e,num_proc);
    }
    else {
      icetCollectImage(_num_requests,my_fragment_size,_group_size,(IceTImage)tile_groups);
    }
  }
  return (IceTImage)tile_groups;
}

Assistant:

IceTImage icetSplitCompose(void)
{
    IceTInt *tile_groups;
    IceTInt my_tile;
    IceTInt group_size;
    IceTSizeType my_fragment_size;

    IceTInt rank;
    IceTInt num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *tile_contribs;
    IceTInt total_image_count;
    IceTInt tile_displayed;
    const IceTInt *tile_viewports;
    IceTInt my_width, my_height;

    IceTInt num_contained_tiles;
    const IceTInt *contained_tiles_list;
    const IceTBoolean *all_contained_tiles_masks;

    int tile, image, node;
    int num_allocated;

    IceTSparseImage incoming;
    IceTVoid **incomingBuffers;
    IceTByte *nextInBuf;  /* Use IceTByte for byte-based pointer arithmetic. */
    IceTSparseImage outgoing;
    IceTImage imageFragment;
    IceTImage fullImage;

    IceTSizeType fragmentSparseImageSize;

    int num_requests;
    IceTCommRequest *requests;

    int first_incoming;

    icetRaiseDebug("In splitStrategy");

    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    tile_contribs = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_contained_tiles);
    contained_tiles_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);

    fullImage = icetImageNull();

  /* Special case: no images rendered whatsoever. */
    if (total_image_count < 1) {
        icetRaiseDebug("Not rendering any images.  Quit early.");
        if (tile_displayed >= 0) {
            my_width = tile_viewports[4*tile_displayed + 2];
            my_height = tile_viewports[4*tile_displayed + 3];
            fullImage = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                                my_width, my_height);
            icetClearImage(fullImage);
        }
        return fullImage;
    }

    tile_groups = icetGetStateBuffer(SPLIT_TILE_GROUPS_BUFFER,
                                     sizeof(int)*(num_tiles+1));

    num_allocated = 0;
    tile_groups[0] = 0;
  /* Set entry of tile_groups[i+1] to the number of processes to help
     compose the image in tile i. */
  /* TODO: Consider tile sizes when allocating processes. */
    for (tile = 0; tile < num_tiles; tile++) {
        int allocate = (tile_contribs[tile]*num_proc)/total_image_count;
        if ((allocate < 1) && (tile_contribs[tile] > 0)) {
            allocate = 1;
        }
        tile_groups[tile+1] = allocate;
        num_allocated += allocate;
    }

  /* Make the number of processes allocated equal exactly the number of
     processes available. */
    while (num_allocated < num_proc) {
      /* Add processes to the tile with the lowest process:image ratio. */
        int min_id = -1;
        float min_ratio = (float)num_proc;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with no contributors. */
            if (tile_contribs[tile] == 0) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio < min_ratio) {
                min_ratio = ratio;
                min_id = tile;
            }
        }
#ifdef DEBUG
        if (min_id < 0) {
            icetRaiseError("Could not find candidate to add tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[min_id+1]++;
        num_allocated++;
    }
    while (num_allocated > num_proc) {
      /* Remove processes from the tile with the highest process:image
         ratio. */
        int max_id = -1;
        float max_ratio = 0;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with a minimum allocation. */
            if (tile_groups[tile+1] <= 1) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio > max_ratio) {
                max_ratio = ratio;
                max_id = tile;
            }
        }
#ifdef DEBUG
        if (max_id < 0) {
            icetRaiseError("Could not find candidate to remove tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[max_id+1]--;
        num_allocated--;
    }

  /* Processes are assigned sequentially from 0 to N to each tile as
     needed.  Change each tile_groups[i] entry to be the lowest rank of the
     processes assigned to tile i.  Thus the processes assigned to tile i
     are tile_groups[i] through tile_groups[i+1]-1. */
    for (tile = 1; tile < num_tiles; tile++) {
        tile_groups[tile] += tile_groups[tile-1];
    }
    tile_groups[num_tiles] = num_proc;

  /* Figure out which tile I am assigned to. */
    for (my_tile = 0; rank >= tile_groups[my_tile+1]; my_tile++);
    icetRaiseDebug1("My tile is %d", my_tile);

    group_size = tile_groups[my_tile+1] - tile_groups[my_tile];
    my_width = tile_viewports[4*my_tile + 2];
    my_height = tile_viewports[4*my_tile + 3];
    my_fragment_size = FRAG_SIZE(max_width*max_height, group_size);

    num_requests = tile_contribs[my_tile];

    fragmentSparseImageSize = icetSparseImageBufferSize(my_fragment_size, 1);

    incomingBuffers
        = icetGetStateBuffer(SPLIT_INCOMING_ARRAY_BUFFER,
                             sizeof(IceTVoid*)*tile_contribs[my_tile]);
    outgoing      = icetGetStateBufferSparseImage(SPLIT_OUTGOING_BUFFER,
                                                  max_width, max_height);
    imageFragment = icetGetStateBufferImage(SPLIT_IMAGE_FRAGMENT_BUFFER,
                                            my_fragment_size, 1);
    fullImage     = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                            max_width, max_height);
    requests = icetGetStateBuffer(SPLIT_REQUEST_BUFFER,
                                  sizeof(IceTCommRequest)*num_requests);

  /* Set up asynchronous receives for all incoming image fragments. */
    nextInBuf = icetGetStateBuffer(SPLIT_INCOMING_BUFFERS,
                                fragmentSparseImageSize*tile_contribs[my_tile]);
    for (image = 0, node = 0; image < tile_contribs[my_tile]; node++) {
        if (all_contained_tiles_masks[node*num_tiles + my_tile]) {
            icetRaiseDebug1("Setting up receive from node %d", node);
            incomingBuffers[image] = nextInBuf;
            requests[image] =
                icetCommIrecv(incomingBuffers[image],
                              fragmentSparseImageSize,
                              ICET_BYTE, node, IMAGE_DATA);
            image++;
            nextInBuf += fragmentSparseImageSize;
        }
    }

  /* Render and send all tile images I am rendering. */
    for (image = 0; image < num_contained_tiles; image++) {
        IceTSizeType sending_frag_size;
        IceTSizeType offset;

        tile = contained_tiles_list[image];
        icetGetTileImage(tile, fullImage);
        icetRaiseDebug1("Rendered image for tile %d", tile);
        offset = 0;
        sending_frag_size = FRAG_SIZE(icetImageGetNumPixels(fullImage),
                                      tile_groups[tile+1]-tile_groups[tile]);
        for (node = tile_groups[tile]; node < tile_groups[tile+1]; node++) {
            IceTVoid *package_buffer;
            IceTSizeType package_size;
            IceTSizeType truncated_size;

            truncated_size = MIN(sending_frag_size,
                                 icetImageGetNumPixels(fullImage) - offset);

            icetRaiseDebug2("Sending tile %d to node %d", tile, node);
            icetRaiseDebug2("Pixels %d to %d",
                            (int)offset, (int)truncated_size-1);
            icetCompressSubImage(fullImage, offset,
                                 truncated_size, outgoing);
            icetSparseImagePackageForSend(outgoing,
                                          &package_buffer, &package_size);
            icetCommSend(package_buffer, package_size,
                         ICET_BYTE, node, IMAGE_DATA);
            offset += truncated_size;
        }
    }

  /* Wait for images to come in and Z compare them. */
    first_incoming = 1;
    for (image = 0; image < tile_contribs[my_tile]; image++) {
        int idx;
        idx = icetCommWaitany(tile_contribs[my_tile], requests);
        incoming = icetSparseImageUnpackageFromReceive(incomingBuffers[idx]);
        if (first_incoming) {
            icetRaiseDebug1("Got first image (%d).", idx);
            icetDecompressImage(incoming, imageFragment);
            first_incoming = 0;
        } else {
            icetRaiseDebug1("Got subsequent image (%d).", idx);
            icetCompressedComposite(imageFragment, incoming, 1);
        }
    }

    if (icetIsEnabled(ICET_COLLECT_IMAGES)) {
        icetCollectImage(imageFragment,
                         my_tile,
                         tile_groups,
                         fullImage);
    } else {
        IceTSizeType offset;

        offset = (rank - tile_groups[my_tile])*my_fragment_size;

        /* Fragment might be truncated.  Adjust my_fragment_size
           appropriately. */
        my_fragment_size = icetImageGetNumPixels(imageFragment);

        icetImageCopyPixels(imageFragment,
                            0,
                            fullImage,
                            offset,
                            my_fragment_size);

        icetStateSetInteger(ICET_VALID_PIXELS_TILE, my_tile);
        icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, offset);
        icetStateSetInteger(ICET_VALID_PIXELS_NUM, my_fragment_size);
    }

    return fullImage;
}